

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

int usageAndExit(char *argv0,int ec)

{
  ostream *poVar1;
  int in_ESI;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1,"[--imf|--core] <file1> [<file2>...]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return in_ESI;
}

Assistant:

static int
usageAndExit (const char* argv0, int ec)
{
    std::cerr << "Usage: " << argv0 << "[--imf|--core] <file1> [<file2>...]"
              << std::endl;
    return ec;
}